

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O0

int engine_load(TLS_IO_INSTANCE *tls)

{
  ENGINE *pEVar1;
  int local_14;
  int result;
  TLS_IO_INSTANCE *tls_local;
  
  pEVar1 = ENGINE_by_id(tls->engine_id);
  tls->engine = (ENGINE *)pEVar1;
  if (tls->engine == (ENGINE *)0x0) {
    log_ERR_get_error("unable to load engine by ID.");
    local_14 = 0x30d;
  }
  else {
    local_14 = 0;
  }
  return local_14;
}

Assistant:

int engine_load(TLS_IO_INSTANCE* tls)
{
    int result;

    // TLSIO is only responsible for the Engine structural reference.
    tls->engine = ENGINE_by_id(tls->engine_id);
    if (tls->engine == NULL)
    {
        log_ERR_get_error("unable to load engine by ID.");
        result = MU_FAILURE;
    }
    else
    {
        result = 0;
    }

    return result;
}